

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

void __thiscall GlobalSimpleStringMemoryAccountant::stop(GlobalSimpleStringMemoryAccountant *this)

{
  UtestShell *pUVar1;
  AccountingTestMemoryAllocator *pAVar2;
  TestTerminatorWithoutExceptions local_10;
  
  if (this->allocator_ == (AccountingTestMemoryAllocator *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001658c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"Global SimpleString allocator stopped without starting",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
               ,0x57);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  pAVar2 = (AccountingTestMemoryAllocator *)SimpleString::stringAllocator_;
  if (SimpleString::stringAllocator_ == (TestMemoryAllocator *)0x0) {
    pAVar2 = (AccountingTestMemoryAllocator *)defaultNewArrayAllocator();
  }
  if (pAVar2 != this->allocator_) {
    pUVar1 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001658c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalStrimpleStringMemoryAccountant: allocator has changed between start and stop!"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
               ,0x5a);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  restoreAllocator(this);
  return;
}

Assistant:

void GlobalSimpleStringMemoryAccountant::stop()
{
    if (allocator_ == NULLPTR)
        FAIL("Global SimpleString allocator stopped without starting");

    if (SimpleString::getStringAllocator() != allocator_)
      FAIL("GlobalStrimpleStringMemoryAccountant: allocator has changed between start and stop!");

    restoreAllocator();
}